

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

ostream * lest::operator<<(ostream *os,comment *note)

{
  size_type sVar1;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  sVar1 = (note->info)._M_string_length;
  if (sVar1 == 0) {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    sVar4 = local_38;
    if (local_40 == &local_30) {
      local_80.field_2._8_8_ = local_30._8_8_;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80._M_dataplus._M_p = (pointer)local_40;
    }
    local_80.field_2._M_allocated_capacity = (ulong)(uint7)local_30._M_allocated_capacity._1_7_ << 8
    ;
    local_38 = 0;
    local_30._M_local_buf[0] = '\0';
    local_60 = &local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      local_50._8_8_ = local_80.field_2._8_8_;
      local_40 = &local_30;
    }
    else {
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_80._M_dataplus._M_p;
      local_40 = &local_30;
    }
  }
  else {
    std::operator+(&local_80," ",&note->info);
    local_60 = &local_50;
    sVar4 = local_80._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      local_50._8_8_ = local_80.field_2._8_8_;
    }
    else {
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_80._M_dataplus._M_p;
    }
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_allocated_capacity =
       local_80.field_2._M_allocated_capacity & 0xffffffffffffff00;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_60->_M_local_buf,sVar4);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  paVar3 = &local_80.field_2;
  if (sVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    paVar3 = &local_30;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}